

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O0

cs_err ARM_global_init(cs_struct *ud)

{
  void *pvVar1;
  cs_struct *in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  ARM_init(in_stack_00000020);
  ARM_getRegName(in_RDI,0);
  in_RDI->printer = ARM_printInst;
  in_RDI->printer_info = pvVar1;
  in_RDI->reg_name = ARM_reg_name;
  in_RDI->insn_id = ARM_get_insn_id;
  in_RDI->insn_name = ARM_insn_name;
  in_RDI->group_name = ARM_group_name;
  in_RDI->post_printer = ARM_post_printer;
  in_RDI->reg_access = ARM_reg_access;
  if ((in_RDI->mode & CS_MODE_M680X_6801) == CS_MODE_ARM) {
    in_RDI->disasm = ARM_getInstruction;
  }
  else {
    in_RDI->disasm = Thumb_getInstruction;
  }
  return CS_ERR_OK;
}

Assistant:

cs_err ARM_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	ARM_init(mri);
	ARM_getRegName(ud, 0);	// use default get_regname

	ud->printer = ARM_printInst;
	ud->printer_info = mri;
	ud->reg_name = ARM_reg_name;
	ud->insn_id = ARM_get_insn_id;
	ud->insn_name = ARM_insn_name;
	ud->group_name = ARM_group_name;
	ud->post_printer = ARM_post_printer;
#ifndef CAPSTONE_DIET
	ud->reg_access = ARM_reg_access;
#endif

	if (ud->mode & CS_MODE_THUMB)
		ud->disasm = Thumb_getInstruction;
	else
		ud->disasm = ARM_getInstruction;

	return CS_ERR_OK;
}